

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap_secure.hpp
# Opt level: O0

Error * __thiscall
ot::commissioner::coap::CoapSecure::Start
          (Error *__return_storage_ptr__,CoapSecure *this,ConnectHandler *aOnConnected,
          string *aLocalAddr,uint16_t aLocalPort)

{
  element_type *this_00;
  Error *args_2;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar1;
  format_args args;
  string_view fmt;
  function<void_(ot::commissioner::DtlsSession_&,_ot::commissioner::Error)> local_1a0;
  anon_class_1_0_00000001 local_17a;
  v10 local_179;
  v10 *local_178;
  char *local_170;
  string local_168;
  Error local_148;
  int local_110;
  undefined1 local_10b;
  undefined1 local_10a [2];
  int fail;
  uint16_t aLocalPort_local;
  string *aLocalAddr_local;
  ConnectHandler *aOnConnected_local;
  CoapSecure *this_local;
  Error *error;
  undefined1 local_b0 [16];
  v10 *local_a0;
  char *local_98;
  unsigned_short *local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_88;
  string *local_80;
  v10 *local_78;
  char *pcStack_70;
  string *local_68;
  v10 *local_60;
  v10 **local_58;
  v10 **local_50;
  v10 *local_48;
  char *pcStack_40;
  Error **local_38;
  undefined1 *local_30;
  Error **local_28;
  Error **local_20;
  undefined8 local_18;
  undefined1 *local_10;
  
  local_10b = 0;
  args_2 = __return_storage_ptr__;
  local_10a = (undefined1  [2])aLocalPort;
  _fail = aLocalAddr;
  aLocalAddr_local = (string *)aOnConnected;
  aOnConnected_local = (ConnectHandler *)this;
  this_local = (CoapSecure *)__return_storage_ptr__;
  Error::Error(__return_storage_ptr__);
  this_00 = std::
            __shared_ptr_access<ot::commissioner::UdpSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<ot::commissioner::UdpSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
  local_110 = UdpSocket::Bind(this_00,_fail,(uint16_t)local_10a);
  if (local_110 == 0) {
    std::function<void_(ot::commissioner::DtlsSession_&,_ot::commissioner::Error)>::function
              (&local_1a0,aOnConnected);
    DtlsSession::Connect(&this->mDtlsSession,&local_1a0);
    std::function<void_(ot::commissioner::DtlsSession_&,_ot::commissioner::Error)>::~function
              (&local_1a0);
  }
  else {
    Start::anon_class_1_0_00000001::operator()(&local_17a);
    local_58 = &local_178;
    local_60 = &local_179;
    bVar1 = ::fmt::v10::operator()(local_60);
    local_170 = (char *)bVar1.size_;
    local_178 = (v10 *)bVar1.data_;
    ::fmt::v10::detail::
    check_format_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short_&,_int_&,_FMT_COMPILE_STRING,_0>
              ();
    local_68 = &local_168;
    local_78 = local_178;
    pcStack_70 = local_170;
    local_80 = _fail;
    local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_10a;
    local_90 = (unsigned_short *)&local_110;
    local_50 = &local_78;
    local_a0 = local_178;
    local_98 = local_170;
    local_48 = local_a0;
    pcStack_40 = local_98;
    ::fmt::v10::
    make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string_const,unsigned_short,int>
              ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short,_int>
                *)&error,(v10 *)_fail,local_88,local_90,(int *)args_2);
    local_30 = local_b0;
    local_38 = &error;
    local_18 = 0x12d;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_38;
    fmt.size_ = 0x12d;
    fmt.data_ = local_98;
    local_28 = local_38;
    local_20 = local_38;
    local_10 = local_30;
    ::fmt::v10::vformat_abi_cxx11_(&local_168,local_a0,fmt,args);
    Error::Error(&local_148,kIOError,&local_168);
    Error::operator=(__return_storage_ptr__,&local_148);
    Error::~Error(&local_148);
    std::__cxx11::string::~string((string *)&local_168);
  }
  return __return_storage_ptr__;
}

Assistant:

Error Start(DtlsSession::ConnectHandler aOnConnected, const std::string &aLocalAddr, uint16_t aLocalPort)
    {
        Error error;

        if (int fail = mSocket->Bind(aLocalAddr, aLocalPort))
        {
            ExitNow(error = ERROR_IO_ERROR("bind socket to local addr={}, port={} failed: {}", aLocalAddr, aLocalPort,
                                           fail));
        }
        mDtlsSession.Connect(aOnConnected);

    exit:
        return error;
    }